

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mask.c
# Opt level: O0

int mask_or_r(uint32_t *dmask,uint32_t *smask,int size)

{
  int local_28;
  uint32_t n;
  int res;
  int i;
  int rsize;
  int size_local;
  uint32_t *smask_local;
  uint32_t *dmask_local;
  
  local_28 = 0;
  for (n = 0; (int)n < (size + 0x1f) / 0x20; n = n + 1) {
    if ((dmask[(int)n] | smask[(int)n]) != dmask[(int)n]) {
      local_28 = 1;
    }
    dmask[(int)n] = dmask[(int)n] | smask[(int)n];
  }
  return local_28;
}

Assistant:

int mask_or_r(uint32_t *dmask, uint32_t *smask, int size) {
	int rsize = MASK_SIZE(size);
	int i;
	int res = 0;
	for (i = 0; i < rsize; i++) {
		uint32_t n = dmask[i] | smask[i];
		if (n != dmask[i])
			res = 1;
		dmask[i] = n;
	}
	return res;
}